

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O0

void __thiscall ProcessesView::onDataUpdated(ProcessesView *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  QVector<ProcessInfo> *this_00;
  long *plVar4;
  long *plVar5;
  long lVar6;
  qsizetype qVar7;
  const_reference pPVar8;
  QAbstractItemModel *this_01;
  QVariant local_300;
  QVariant local_2e0;
  QVariant local_2c0;
  QVariant local_2a0;
  QVariant local_280;
  QVariant local_260;
  QVariant local_240;
  QVariant local_220;
  QVariant local_200;
  ProcessInfo *local_1e0;
  ProcessInfo *process;
  const_iterator local_1d0;
  const_iterator __end1;
  const_iterator __begin1;
  QVector<ProcessInfo> *__range1;
  int local_19c;
  undefined1 local_198 [4];
  int rowCount;
  QVariant local_178;
  QVariant local_158;
  QVariant local_138;
  QVariant local_118;
  QVariant local_f8;
  const_reference local_d8;
  ProcessInfo *processInfo;
  int local_b4;
  int local_b0;
  int j;
  int index;
  QModelIndex local_a0;
  undefined1 local_88 [24];
  QVariant local_70;
  undefined1 local_50 [8];
  QString pid;
  int local_1c;
  int i;
  QVector<ProcessInfo> *processes;
  ProcessesView *this_local;
  
  QTreeView::setSortingEnabled(SUB81(this,0));
  this_00 = InfoProvider::getProcesses();
  plVar4 = (long *)QAbstractItemView::model();
  QModelIndex::QModelIndex((QModelIndex *)&pid.d.size);
  local_1c = (**(code **)(*plVar4 + 0x78))(plVar4,&pid.d.size);
  do {
    local_1c = local_1c + -1;
    if (local_1c < 0) {
      plVar4 = (long *)QAbstractItemView::model();
      QModelIndex::QModelIndex((QModelIndex *)&__range1);
      local_19c = (**(code **)(*plVar4 + 0x78))(plVar4,&__range1);
      __end1 = QList<ProcessInfo>::begin(this_00);
      local_1d0 = QList<ProcessInfo>::end(this_00);
      while( true ) {
        process = local_1d0.i;
        bVar2 = QList<ProcessInfo>::const_iterator::operator!=(&__end1,local_1d0);
        if (!bVar2) break;
        local_1e0 = QList<ProcessInfo>::const_iterator::operator*(&__end1);
        iVar3 = getRowIndexByPid(this,&local_1e0->pid);
        iVar1 = local_19c;
        if (iVar3 == -1) {
          QVariant::QVariant(&local_200,(QString *)local_1e0);
          addItem(this,iVar1,0,&local_200);
          QVariant::~QVariant(&local_200);
          iVar1 = local_19c;
          QVariant::QVariant(&local_220,(QString *)&local_1e0->type);
          addItem(this,iVar1,1,&local_220);
          QVariant::~QVariant(&local_220);
          iVar1 = local_19c;
          convertToInt(&local_240,&local_1e0->gpuIdx);
          addItem(this,iVar1,2,&local_240);
          QVariant::~QVariant(&local_240);
          iVar1 = local_19c;
          convertToInt(&local_260,&local_1e0->pid);
          addItem(this,iVar1,3,&local_260);
          QVariant::~QVariant(&local_260);
          iVar1 = local_19c;
          convertToInt(&local_280,&local_1e0->sm);
          addItem(this,iVar1,5,&local_280);
          QVariant::~QVariant(&local_280);
          iVar1 = local_19c;
          convertToInt(&local_2a0,&local_1e0->mem);
          addItem(this,iVar1,6,&local_2a0);
          QVariant::~QVariant(&local_2a0);
          iVar1 = local_19c;
          convertToInt(&local_2c0,&local_1e0->enc);
          addItem(this,iVar1,7,&local_2c0);
          QVariant::~QVariant(&local_2c0);
          iVar1 = local_19c;
          convertToInt(&local_2e0,&local_1e0->dec);
          addItem(this,iVar1,8,&local_2e0);
          QVariant::~QVariant(&local_2e0);
          iVar1 = local_19c;
          convertToInt(&local_300,&local_1e0->fbmem);
          addItem(this,iVar1,4,&local_300);
          QVariant::~QVariant(&local_300);
          local_19c = local_19c + 1;
        }
        QList<ProcessInfo>::const_iterator::operator++(&__end1);
      }
      QTreeView::setSortingEnabled(SUB81(this,0));
      return;
    }
    plVar4 = (long *)QAbstractItemView::model();
    plVar5 = (long *)QAbstractItemView::model();
    QModelIndex::QModelIndex(&local_a0);
    (**(code **)(*plVar5 + 0x60))(local_88,plVar5,local_1c,3,&local_a0);
    (**(code **)(*plVar4 + 0x90))(&local_70,plVar4,local_88,0);
    QVariant::toString();
    QVariant::~QVariant(&local_70);
    local_b0 = -1;
    local_b4 = 0;
    while( true ) {
      lVar6 = (long)local_b4;
      qVar7 = QList<ProcessInfo>::size(this_00);
      if (qVar7 <= lVar6) break;
      pPVar8 = QList<ProcessInfo>::operator[](this_00,(long)local_b4);
      bVar2 = operator==(&pPVar8->pid,(QString *)local_50);
      if (bVar2) {
        local_b0 = local_b4;
        break;
      }
      local_b4 = local_b4 + 1;
    }
    if (local_b0 == -1) {
      this_01 = (QAbstractItemModel *)QAbstractItemView::model();
      QModelIndex::QModelIndex((QModelIndex *)&processInfo);
      QAbstractItemModel::removeRow(this_01,local_1c,(QModelIndex *)&processInfo);
    }
    else {
      local_d8 = QList<ProcessInfo>::operator[](this_00,(long)local_b0);
      QVariant::QVariant(&local_f8,(QString *)&local_d8->type);
      updateItem(this,local_1c,1,&local_f8);
      QVariant::~QVariant(&local_f8);
      convertToInt(&local_118,&local_d8->sm);
      updateItem(this,local_1c,5,&local_118);
      QVariant::~QVariant(&local_118);
      convertToInt(&local_138,&local_d8->mem);
      updateItem(this,local_1c,6,&local_138);
      QVariant::~QVariant(&local_138);
      convertToInt(&local_158,&local_d8->enc);
      updateItem(this,local_1c,7,&local_158);
      QVariant::~QVariant(&local_158);
      convertToInt(&local_178,&local_d8->dec);
      updateItem(this,local_1c,8,&local_178);
      QVariant::~QVariant(&local_178);
      convertToInt((QVariant *)local_198,&local_d8->fbmem);
      updateItem(this,local_1c,4,(QVariant *)local_198);
      QVariant::~QVariant((QVariant *)local_198);
    }
    QString::~QString((QString *)local_50);
  } while( true );
}

Assistant:

void ProcessesView::onDataUpdated() {
    // In order to avoid performance and other issues, sorting will be enabled after inserting
    // and updating the items in the tree: https://doc.qt.io/qt-5/qtreeview.html#sortingEnabled-prop
    setSortingEnabled(false);

    const auto &processes = InfoProvider::getProcesses();

    // update existing processes list & remove finished processes
    // loop from more to less in order to delete rows
    for (int i = model()->rowCount() - 1; i >= 0; i--) {
        QString pid = model()->data(model()->index(i, NVSMColumns::PID)).toString();

        int index = -1;

        for (int j = 0; j < processes.size(); ++j) {
            if (processes[j].pid == pid) {
                index = j;
                break;
            }
        }

        if (index == -1) {
            model()->removeRow(i);
        } else {
            const ProcessInfo &processInfo = processes[index];

            // update what may change
            updateItem(i, NVSMColumns::Type, processInfo.type);
            updateItem(i, NVSMColumns::Sm, convertToInt(processInfo.sm));
            updateItem(i, NVSMColumns::Mem, convertToInt(processInfo.mem));
            updateItem(i, NVSMColumns::Enc, convertToInt(processInfo.enc));
            updateItem(i, NVSMColumns::Dec, convertToInt(processInfo.dec));
            updateItem(i, NVSMColumns::FbMem, convertToInt(processInfo.fbmem));
        }
    }

    // add new processes to the list, if there are any
    int rowCount = model()->rowCount();
    for (auto &process : processes) {
        if (getRowIndexByPid(process.pid) == -1) {
            addItem(rowCount, NVSMColumns::Name, process.name);
            addItem(rowCount, NVSMColumns::Type, process.type);
            addItem(rowCount, NVSMColumns::GPUIdx, convertToInt(process.gpuIdx));
            addItem(rowCount, NVSMColumns::PID, convertToInt(process.pid));
            addItem(rowCount, NVSMColumns::Sm, convertToInt(process.sm));
            addItem(rowCount, NVSMColumns::Mem, convertToInt(process.mem));
            addItem(rowCount, NVSMColumns::Enc, convertToInt(process.enc));
            addItem(rowCount, NVSMColumns::Dec, convertToInt(process.dec));
            addItem(rowCount, NVSMColumns::FbMem, convertToInt(process.fbmem));

            rowCount++;
        }
    }

    setSortingEnabled(true);
}